

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatTransientSingleSpace.h
# Opt level: O0

void __thiscall
TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>>::ContributeBCInterface
          (TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>> *this)

{
  TPZBndCondT<double> *in_stack_00000010;
  TPZFMatrix<double> *in_stack_00000018;
  TPZFMatrix<double> *in_stack_00000020;
  REAL in_stack_00000028;
  TPZMaterialDataT<double> *in_stack_00000030;
  TPZMaterialDataT<double> *in_stack_00000038;
  TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>_> *in_stack_00000040;
  
  TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>_>::ContributeBCInterface
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
             in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

void TPZMatTransientSingleSpace< TBASEMAT >::ContributeBCInterface(
    const TPZMaterialDataT<STATE> &data,
    const TPZMaterialDataT<STATE> &dataleft,
    REAL weight, 
    TPZFMatrix<STATE> &ek,
    TPZFMatrix<STATE> &ef,
    TPZBndCondT<STATE> &bc)
{
	// Mostly for implicit
	if (this->fStep == ECurrent){
		TBASEMAT::ContributeBCInterface(data,dataleft, weight,ek, ef, bc);
		return;
	}
	
	if (this->fStep == ELast){
		return;
	}
	
	
	// Mostly for explicit
	if (this->fStep == EMassMatrix){
		return;
	}
	if (this->fStep == EFluxOnly){ //Calculates ef = F-ku
		TBASEMAT::ContributeBCInterface(data, dataleft, weight,  ek, ef, bc);
		return;
	}
	
	
	PZError << "ERROR! " << __PRETTY_FUNCTION__ << " at LINE " << __LINE__ << std::endl;
	
}